

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> * __thiscall
Lib::OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>::
operator=(OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
          *this,OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                *other)

{
  Node ***t;
  byte *in_RSI;
  OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *in_RDI;
  Node **local_18;
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**> *
           )0x3ca627);
  }
  if ((*local_10 & 1) != 0) {
    t = unwrap((OptionBase<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>
                *)0x3ca648);
    local_18 = move_if_value<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**,_true>
                         (t);
    MaybeUninit<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_**>::init
              (&in_RDI->_elem,(EVP_PKEY_CTX *)&local_18);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }